

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentiallyDecayingReservoir.cc
# Opt level: O0

void __thiscall
cppmetrics::ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir
          (ExponentiallyDecayingReservoir *this,ExponentiallyDecayingReservoir *other)

{
  __int_type _Var1;
  mutex_type *pmVar2;
  lock_guard<std::mutex> local_78;
  lock_guard<std::mutex> lock;
  ExponentiallyDecayingReservoir *other_local;
  ExponentiallyDecayingReservoir *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  lock._M_device = (mutex_type *)other;
  Reservoir::Reservoir(&this->super_Reservoir);
  (this->super_Reservoir)._vptr_Reservoir =
       (_func_int **)&PTR__ExponentiallyDecayingReservoir_00190778;
  std::mutex::mutex(&this->m_mutex);
  std::
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  ::map(&this->m_samples);
  std::lock_guard<std::mutex>::lock_guard
            (&local_78,(mutex_type *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8));
  pmVar2 = lock._M_device + 1;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  _Var1 = *(__int_type *)((long)&(pmVar2->super___mutex_base)._M_mutex + 8);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i = _Var1;
  UNLOCK();
  this->m_clock = *(Clock **)((long)&lock._M_device[1].super___mutex_base._M_mutex + 0x10);
  this->m_start = (time_t)lock._M_device[1].super___mutex_base._M_mutex.__data.__list.__prev;
  this->m_next_rescale_time =
       (time_t)lock._M_device[1].super___mutex_base._M_mutex.__data.__list.__next;
  this->m_size = lock._M_device[2].super___mutex_base._M_mutex.__align;
  this->m_alpha = *(double *)((long)&lock._M_device[2].super___mutex_base._M_mutex + 8);
  std::
  map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
  ::operator=(&this->m_samples,
              (map<double,_cppmetrics::WeightedSample,_std::less<double>,_std::allocator<std::pair<const_double,_cppmetrics::WeightedSample>_>_>
               *)((long)&lock._M_device[2].super___mutex_base._M_mutex + 0x10));
  pmVar2 = lock._M_device + 1;
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  *(undefined8 *)((long)&(pmVar2->super___mutex_base)._M_mutex + 8) = 0;
  UNLOCK();
  *(undefined8 *)((long)&lock._M_device[1].super___mutex_base._M_mutex + 0x10) = 0;
  lock._M_device[1].super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  lock._M_device[1].super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  lock._M_device[2].super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&lock._M_device[2].super___mutex_base._M_mutex + 8) = 0;
  std::lock_guard<std::mutex>::~lock_guard(&local_78);
  return;
}

Assistant:

ExponentiallyDecayingReservoir::ExponentiallyDecayingReservoir(ExponentiallyDecayingReservoir&& other)
{
  std::lock_guard<std::mutex> lock(other.m_mutex);

  m_count.store(other.m_count.load());
  m_clock = other.m_clock;
  m_start = other.m_start;
  m_next_rescale_time = other.m_next_rescale_time;
  m_size = other.m_size;
  m_alpha = other.m_alpha;
  m_samples = std::move(other.m_samples);

  other.m_count.store(0);
  other.m_clock = nullptr;
  other.m_start = 0;
  other.m_next_rescale_time = 0;
  other.m_size = 0;
  other.m_alpha = 0.0;
  // other.m_samples is already moved
}